

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makePointerFromForwardPointer
          (Builder *this,StorageClass storageClass,Id forwardPointerType,Id pointee)

{
  key_type kVar1;
  uint uVar2;
  Id IVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  reference ppIVar6;
  Instruction *pIVar7;
  mapped_type_conflict *pmVar8;
  Instruction *debugForwardPointer;
  key_type local_40 [4];
  Instruction *pIStack_30;
  int t;
  Instruction *type;
  Id local_20;
  Id pointee_local;
  Id forwardPointerType_local;
  StorageClass storageClass_local;
  Builder *this_local;
  
  local_40[3] = 0;
  type._4_4_ = pointee;
  local_20 = forwardPointerType;
  pointee_local = storageClass;
  _forwardPointerType_local = this;
  while( true ) {
    kVar1 = local_40[3];
    local_40[2] = 0x20;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_40 + 2);
    sVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar4);
    if ((int)sVar5 <= (int)kVar1) {
      pIVar7 = (Instruction *)::operator_new(0x60);
      spv::Instruction::Instruction(pIVar7,local_20,0,OpTypePointer);
      pIStack_30 = pIVar7;
      spv::Instruction::reserveOperands(pIVar7,2);
      spv::Instruction::addImmediateOperand(pIStack_30,pointee_local);
      spv::Instruction::addIdOperand(pIStack_30,type._4_4_);
      local_40[0] = 0x20;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,local_40);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar4,&stack0xffffffffffffffd0);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
                 &debugForwardPointer,pIStack_30);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)&debugForwardPointer);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &debugForwardPointer);
      Module::mapInstruction(&this->module,pIStack_30);
      if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
        pmVar8 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,&local_20);
        pIVar7 = Module::getInstruction(&this->module,*pmVar8);
        pmVar8 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,(key_type_conflict *)((long)&type + 4));
        if (*pmVar8 == 0) {
          __assert_fail("debugId[pointee]",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                        ,0xd8,"Id spv::Builder::makePointerFromForwardPointer(StorageClass, Id, Id)"
                       );
        }
        pmVar8 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,(key_type_conflict *)((long)&type + 4));
        spv::Instruction::setIdOperand(pIVar7,2,*pmVar8);
      }
      IVar3 = spv::Instruction::getResultId(pIStack_30);
      return IVar3;
    }
    local_40[1] = 0x20;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_40 + 1);
    ppIVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar4,(long)(int)local_40[3]);
    pIStack_30 = *ppIVar6;
    uVar2 = spv::Instruction::getImmediateOperand(pIStack_30,0);
    if ((uVar2 == pointee_local) &&
       (IVar3 = spv::Instruction::getIdOperand(pIStack_30,1), IVar3 == type._4_4_)) break;
    local_40[3] = local_40[3] + 1;
  }
  IVar3 = spv::Instruction::getResultId(pIStack_30);
  return IVar3;
}

Assistant:

Id Builder::makePointerFromForwardPointer(StorageClass storageClass, Id forwardPointerType, Id pointee)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypePointer].size(); ++t) {
        type = groupedTypes[OpTypePointer][t];
        if (type->getImmediateOperand(0) == (unsigned)storageClass &&
            type->getIdOperand(1) == pointee)
            return type->getResultId();
    }

    type = new Instruction(forwardPointerType, NoType, OpTypePointer);
    type->reserveOperands(2);
    type->addImmediateOperand(storageClass);
    type->addIdOperand(pointee);
    groupedTypes[OpTypePointer].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    // If we are emitting nonsemantic debuginfo, we need to patch the debug pointer type
    // that was emitted alongside the forward pointer, now that we have a pointee debug
    // type for it to point to.
    if (emitNonSemanticShaderDebugInfo) {
        Instruction *debugForwardPointer = module.getInstruction(debugId[forwardPointerType]);
        assert(debugId[pointee]);
        debugForwardPointer->setIdOperand(2, debugId[pointee]);
    }

    return type->getResultId();
}